

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  undefined4 in_ESI;
  long in_RDI;
  ImGuiWindow *child;
  ImGuiWindow **__end1;
  ImGuiWindow **__begin1;
  ImVector<ImGuiWindow_*> *__range1;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  ImVector<ImDrawList_*> *in_stack_ffffffffffffffb8;
  ImDrawData *in_stack_ffffffffffffffc0;
  ImGuiWindow **local_30;
  ImGuiContext *pIVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  pIVar3 = GImGui;
  ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
  (pIVar3->IO).MetricsRenderWindows = (pIVar3->IO).MetricsRenderWindows + 1;
  if (1 < *(int *)(*(long *)(in_RDI + 0x2b0) + 0x84)) {
    ImDrawList::ChannelsMerge((ImDrawList *)0x20c69e);
  }
  ImGui::AddDrawListToDrawDataEx
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ImDrawList *)0x20c6ca);
  local_30 = ImVector<ImGuiWindow_*>::begin((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a8));
  ppIVar2 = ImVector<ImGuiWindow_*>::end((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a8));
  for (; local_30 != ppIVar2; local_30 = local_30 + 1) {
    bVar1 = IsWindowActiveAndVisible(*local_30);
    if (bVar1) {
      AddWindowToDrawData((ImGuiWindow *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (int)((ulong)pIVar3 >> 0x20));
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    g.IO.MetricsRenderWindows++;
    if (window->DrawList->_Splitter._Count > 1)
        window->DrawList->ChannelsMerge(); // Merge if user forgot to merge back. Also required in Docking branch for ImGuiWindowFlags_DockNodeHost windows.
    ImGui::AddDrawListToDrawDataEx(&viewport->DrawDataP, viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (ImGuiWindow* child : window->DC.ChildWindows)
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
}